

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_equal.c
# Opt level: O2

_Bool run_container_equals_array(run_container_t *container1,array_container_t *container2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  _Bool _Var7;
  
  iVar3 = run_container_cardinality(container1);
  uVar5 = 0;
  _Var7 = false;
  if (iVar3 == container2->cardinality) {
    uVar4 = (ulong)(uint)container1->n_runs;
    if (container1->n_runs < 1) {
      uVar4 = uVar5;
    }
    for (uVar6 = 0; _Var7 = uVar4 == uVar6, !_Var7; uVar6 = uVar6 + 1) {
      uVar1 = container1->runs[uVar6].value;
      iVar3 = (int)uVar5;
      if (container2->array[iVar3] != uVar1) {
        return _Var7;
      }
      uVar2 = container1->runs[uVar6].length;
      if ((uint)uVar1 + (uint)uVar2 != (uint)container2->array[iVar3 + (uint)uVar2]) {
        return _Var7;
      }
      uVar5 = (ulong)(iVar3 + (uint)uVar2 + 1);
    }
  }
  return _Var7;
}

Assistant:

bool run_container_equals_array(const run_container_t* container1,
                                const array_container_t* container2) {
    if (run_container_cardinality(container1) != container2->cardinality)
        return false;
    int32_t pos = 0;
    for (int i = 0; i < container1->n_runs; ++i) {
        const uint32_t run_start = container1->runs[i].value;
        const uint32_t le = container1->runs[i].length;

        if (container2->array[pos] != run_start) {
            return false;
        }

        if (container2->array[pos + le] != run_start + le) {
            return false;
        }

        pos += le + 1;
    }
    return true;
}